

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcknowledgePdu.cpp
# Opt level: O3

void __thiscall DIS::AcknowledgePdu::marshal(AcknowledgePdu *this,DataStream *dataStream)

{
  SimulationManagementFamilyPdu::marshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  EntityID::marshal(&this->_originatingID,dataStream);
  EntityID::marshal(&this->_receivingID,dataStream);
  DataStream::operator<<(dataStream,this->_acknowledgeFlag);
  DataStream::operator<<(dataStream,this->_responseFlag);
  DataStream::operator<<(dataStream,this->_requestID);
  return;
}

Assistant:

void AcknowledgePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _originatingID.marshal(dataStream);
    _receivingID.marshal(dataStream);
    dataStream << _acknowledgeFlag;
    dataStream << _responseFlag;
    dataStream << _requestID;
}